

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_binary.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  return_type rVar1;
  int16_t iVar2;
  Offset<flatbuffers::String> name_00;
  Offset<flatbuffers::Vector<unsigned_char>_> inventory_00;
  Offset<MyGame::Sample::Monster> root;
  int iVar3;
  uint8_t *buf;
  Monster *this;
  String *this_00;
  char *__s1;
  Vec3 *this_01;
  Vector<unsigned_char> *this_02;
  float fVar4;
  Vector<unsigned_char> *inv;
  Vec3 *pos;
  Monster *monster;
  Offset<MyGame::Sample::Monster> mloc;
  Offset<flatbuffers::Vector<unsigned_char>_> inventory;
  uchar inv_data [10];
  Offset<flatbuffers::String> name;
  undefined1 local_84 [8];
  Vec3 vec;
  FlatBufferBuilder builder;
  char **argv_local;
  int argc_local;
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder((FlatBufferBuilder *)&vec.y_,0x400);
  MyGame::Sample::Vec3::Vec3((Vec3 *)local_84,1.0,2.0,3.0);
  name_00 = flatbuffers::FlatBufferBuilder::CreateString((FlatBufferBuilder *)&vec.y_,"MyMonster");
  _mloc = 0x706050403020100;
  inventory_00 = flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>
                           ((FlatBufferBuilder *)&vec.y_,(uchar *)&mloc,10);
  root = MyGame::Sample::CreateMonster
                   ((FlatBufferBuilder *)&vec.y_,(Vec3 *)local_84,0x96,0x50,name_00,inventory_00,
                    '\x02');
  flatbuffers::FlatBufferBuilder::Finish<MyGame::Sample::Monster>((FlatBufferBuilder *)&vec.y_,root)
  ;
  buf = flatbuffers::FlatBufferBuilder::GetBufferPointer((FlatBufferBuilder *)&vec.y_);
  this = MyGame::Sample::GetMonster(buf);
  iVar2 = MyGame::Sample::Monster::hp(this);
  if (iVar2 != 0x50) {
    __assert_fail("monster->hp() == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x32,"int main(int, const char **)");
  }
  iVar2 = MyGame::Sample::Monster::mana(this);
  if (iVar2 != 0x96) {
    __assert_fail("monster->mana() == 150",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x33,"int main(int, const char **)");
  }
  this_00 = MyGame::Sample::Monster::name(this);
  __s1 = flatbuffers::String::c_str(this_00);
  iVar3 = strcmp(__s1,"MyMonster");
  if (iVar3 != 0) {
    __assert_fail("!strcmp(monster->name()->c_str(), \"MyMonster\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x34,"int main(int, const char **)");
  }
  this_01 = MyGame::Sample::Monster::pos(this);
  if (this_01 != (Vec3 *)0x0) {
    fVar4 = MyGame::Sample::Vec3::z(this_01);
    if ((fVar4 != 3.0) || (NAN(fVar4))) {
      __assert_fail("pos->z() == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x38,"int main(int, const char **)");
    }
    this_02 = MyGame::Sample::Monster::inventory(this);
    if (this_02 == (Vector<unsigned_char> *)0x0) {
      __assert_fail("inv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x3b,"int main(int, const char **)");
    }
    rVar1 = flatbuffers::Vector<unsigned_char>::Get(this_02,9);
    if (rVar1 == '\t') {
      flatbuffers::FlatBufferBuilder::~FlatBufferBuilder((FlatBufferBuilder *)&vec.y_);
      return 0;
    }
    __assert_fail("inv->Get(9) == 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x3c,"int main(int, const char **)");
  }
  __assert_fail("pos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                ,0x37,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char *argv[]) {
  // Build up a serialized buffer algorithmically:
  flatbuffers::FlatBufferBuilder builder;

  auto vec = Vec3(1, 2, 3);

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  // Shortcut for creating monster with all fields set:
  auto mloc = CreateMonster(builder, &vec, 150, 80, name, inventory,
                            Color_Blue);

  builder.Finish(mloc);
  // We now have a FlatBuffer we can store or send somewhere.

  // ** file/network code goes here :) **
  // access builder.GetBufferPointer() for builder.GetSize() bytes

  // Instead, we're going to access it straight away.
  // Get access to the root:
  auto monster = GetMonster(builder.GetBufferPointer());

  assert(monster->hp() == 80);
  assert(monster->mana() == 150);  // default
  assert(!strcmp(monster->name()->c_str(), "MyMonster"));

  auto pos = monster->pos();
  assert(pos);
  assert(pos->z() == 3);

  auto inv = monster->inventory();
  assert(inv);
  assert(inv->Get(9) == 9);
}